

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

void __thiscall QToolBarLayout::setGeometry(QToolBarLayout *this,QRect *rect)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Orientation OVar4;
  int iVar5;
  int iVar6;
  Orientation o_00;
  QToolBar *pQVar7;
  QStyle *pQVar8;
  QMainWindow *pQVar9;
  int *piVar10;
  QToolBarLayout *in_RDI;
  long in_FS_OFFSET;
  QMainWindow *win;
  ToolBarArea area;
  bool ranOutOfSpace;
  Orientation o;
  int extensionExtent;
  QStyle *style;
  QToolBar *tb;
  QRect r;
  QSize size;
  QPoint pos;
  QSize hint;
  QMargins margins;
  QStyleOptionToolBar opt;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  Orientation in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  Orientation in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  Orientation in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  LayoutDirection in_stack_fffffffffffffebc;
  Orientation in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffec8;
  Orientation OVar11;
  ToolBarArea local_110;
  bool local_109;
  undefined1 local_60 [32];
  QSize *in_stack_ffffffffffffffc0;
  QToolBarLayout *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget((QLayout *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  pQVar7 = qobject_cast<QToolBar*>((QObject *)0x6fdef6);
  if (pQVar7 != (QToolBar *)0x0) {
    pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                           );
    memset(local_60,0xaa,0x58);
    QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)0x6fdf44);
    (**(code **)(*(long *)&pQVar7->super_QWidget + 0x1a0))(pQVar7,local_60);
    QLayout::contentsMargins
              ((QLayout *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    iVar3 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x39,local_60,pQVar7);
    OVar4 = QToolBar::orientation
                      ((QToolBar *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    QLayout::setGeometry
              ((QLayout *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (QRect *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    updateMacBorderMetrics(in_RDI);
    local_109 = false;
    if (((byte)in_RDI[0x1d] & 1) == 0) {
      QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      local_109 = layoutActions(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    }
    if (((((byte)in_RDI[0x1c] & 1) == 0) && (((byte)in_RDI[0x1d] & 1) == 0)) && (local_109 == false)
       ) {
      bVar2 = QWidget::isHidden((QWidget *)0x6fe465);
      if (!bVar2) {
        QWidget::hide((QWidget *)0x6fe477);
      }
    }
    else {
      local_110 = TopToolBarArea;
      QWidget::parentWidget((QWidget *)0x6fe05c);
      pQVar9 = qobject_cast<QMainWindow*>((QObject *)0x6fe064);
      if (pQVar9 != (QMainWindow *)0x0) {
        local_110 = QMainWindow::toolBarArea
                              ((QMainWindow *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (QToolBar *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      (**(code **)(*(long *)in_RDI + 0xf0))();
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      OVar11 = OVar4;
      QRect::bottomRight((QRect *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      iVar5 = pick(in_stack_fffffffffffffe94,
                   (QPoint *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QMargins::bottom((QMargins *)0x6fe10f);
      QMargins::right((QMargins *)0x6fe120);
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
      iVar6 = pick(in_stack_fffffffffffffe94,
                   (QSize *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      piVar10 = rpick(in_stack_fffffffffffffe94,
                      (QPoint *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      *piVar10 = ((iVar5 - iVar6) - iVar3) + 2;
      if ((local_110 == LeftToolBarArea) || (local_110 == TopToolBarArea)) {
        QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        in_stack_fffffffffffffec4 =
             perp(in_stack_fffffffffffffe94,
                  (QPoint *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        in_stack_fffffffffffffec0 = OVar4;
        in_stack_fffffffffffffebc = QMargins::top((QMargins *)0x6fe1c7);
        QMargins::left((QMargins *)0x6fe1d8);
        QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
        in_stack_fffffffffffffec8 =
             perp(in_stack_fffffffffffffe94,
                  (QSize *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        in_stack_fffffffffffffec8 = in_stack_fffffffffffffec4 + in_stack_fffffffffffffec8;
        piVar10 = rperp(in_stack_fffffffffffffe94,
                        (QPoint *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        *piVar10 = in_stack_fffffffffffffec8;
      }
      else {
        in_stack_fffffffffffffe9c = OVar4;
        QRect::bottomRight((QRect *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        in_stack_fffffffffffffea8 =
             perp(in_stack_fffffffffffffe94,
                  (QPoint *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        in_stack_fffffffffffffea4 = OVar4;
        in_stack_fffffffffffffea0 = QMargins::bottom((QMargins *)0x6fe26b);
        QMargins::right((QMargins *)0x6fe27c);
        QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
        in_stack_fffffffffffffeb0 =
             perp(in_stack_fffffffffffffe94,
                  (QSize *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        in_stack_fffffffffffffeb0 = in_stack_fffffffffffffea8 - in_stack_fffffffffffffeb0;
        in_stack_fffffffffffffeac =
             perp(in_stack_fffffffffffffe94,
                  (QSize *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        iVar5 = perp(in_stack_fffffffffffffea4,
                     (QMargins *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        in_stack_fffffffffffffeb4 =
             (in_stack_fffffffffffffeb0 - (in_stack_fffffffffffffeac - iVar5)) + 1;
        piVar10 = rperp(in_stack_fffffffffffffe94,
                        (QPoint *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        *piVar10 = in_stack_fffffffffffffeb4;
      }
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      piVar10 = rpick(in_stack_fffffffffffffe94,
                      (QSize *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      *piVar10 = iVar3;
      o_00 = perp(in_stack_fffffffffffffe94,
                  (QSize *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      iVar3 = perp(in_stack_fffffffffffffea4,
                   (QMargins *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      iVar3 = o_00 - iVar3;
      piVar10 = rperp(o_00,(QSize *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      *piVar10 = iVar3;
      QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (QPoint *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (QSize *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      if (OVar4 == Horizontal) {
        QLayout::parentWidget
                  ((QLayout *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        QWidget::layoutDirection((QWidget *)0x6fe3d6);
        QStyle::visualRect(in_stack_fffffffffffffebc,
                           (QRect *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                           (QRect *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      }
      QWidget::setGeometry
                ((QWidget *)CONCAT44(OVar11,in_stack_fffffffffffffec8),
                 (QRect *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      bVar2 = QWidget::isHidden((QWidget *)0x6fe441);
      if (bVar2) {
        QWidget::show((QWidget *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      }
    }
    QStyleOptionToolBar::~QStyleOptionToolBar((QStyleOptionToolBar *)0x6fe486);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarLayout::setGeometry(const QRect &rect)
{
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const QMargins margins = contentsMargins();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();

    QLayout::setGeometry(rect);

    updateMacBorderMetrics();

    bool ranOutOfSpace = false;
    if (!animating)
        ranOutOfSpace = layoutActions(rect.size());

    if (expanded || animating || ranOutOfSpace) {
        Qt::ToolBarArea area = Qt::TopToolBarArea;
        if (QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget()))
            area = win->toolBarArea(tb);
        QSize hint = sizeHint();

        QPoint pos;
        rpick(o, pos) = pick(o, rect.bottomRight()) -
                pick(o, QSize(margins.bottom(), margins.right())) - extensionExtent + 2;
        if (area == Qt::LeftToolBarArea || area == Qt::TopToolBarArea)
            rperp(o, pos) = perp(o, rect.topLeft()) +
                    perp(o, QSize(margins.top(), margins.left()));
        else
            rperp(o, pos) = perp(o, rect.bottomRight()) -
                    perp(o, QSize(margins.bottom(), margins.right())) -
                    (perp(o, hint) - perp(o, margins)) + 1;
        QSize size;
        rpick(o, size) = extensionExtent;
        rperp(o, size) = perp(o, hint) - perp(o, margins);
        QRect r(pos, size);

        if (o == Qt::Horizontal)
            r = QStyle::visualRect(parentWidget()->layoutDirection(), rect, r);

        extension->setGeometry(r);

        if (extension->isHidden())
            extension->show();
    } else {
        if (!extension->isHidden())
            extension->hide();
    }
}